

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_AABBTree.cpp
# Opt level: O0

bool __thiscall Opcode::AABBTree::Refit2(AABBTree *this,AABBTreeBuilder *builder)

{
  undefined8 uVar1;
  undefined8 uVar2;
  AABBTreeNode *this_00;
  ulong uVar3;
  uint uVar4;
  float local_384;
  float local_380;
  float local_37c;
  float local_36c;
  float local_368;
  float local_364;
  float *local_348;
  float *local_330;
  AABBTreeNode *Current;
  udword Index;
  Point Max_;
  Point Min_;
  undefined1 local_2a8 [8];
  Point Max;
  Point Min;
  AABBTreeBuilder *builder_local;
  AABBTree *this_local;
  AABBTreeNode *P_1;
  AABBTreeNode *P;
  float local_184;
  float fStack_180;
  float *local_178;
  float *local_170;
  float *local_168;
  float local_15c;
  float fStack_158;
  float *local_150;
  float *local_148;
  float *local_140;
  undefined8 local_134;
  long local_128;
  float *local_120;
  undefined8 *local_118;
  float local_10c;
  float fStack_108;
  undefined1 *local_100;
  float *local_f8;
  float *local_f0;
  float *local_e8;
  float *local_e0;
  long local_d8;
  undefined1 *local_d0;
  float *local_c8;
  float *local_c0;
  float *local_b8;
  float local_ac;
  float local_a8;
  float local_a4;
  float *local_a0;
  float *local_98;
  float *local_90;
  float *local_88;
  float local_7c;
  float local_78;
  float local_74;
  float *local_70;
  float *local_68;
  float *local_60;
  float *local_58;
  float local_4c;
  float local_48;
  float local_44;
  float *local_40;
  float *local_38;
  float *local_30;
  undefined8 *local_28;
  float local_1c;
  float local_18;
  float local_14;
  undefined8 *local_10;
  
  if (builder == (AABBTreeBuilder *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    Current._0_4_ = this->mTotalNbNodes;
    while (uVar4 = (uint)Current - 1, (uint)Current != 0) {
      this_00 = this->mPool + uVar4;
      Current._0_4_ = uVar4;
      if ((this_00->mPos & 0xfffffffffffffffe) == 0) {
        (*builder->_vptr_AABBTreeBuilder[2])
                  (builder,this_00->mNodePrimitives,(ulong)this_00->mNbPrimitives,this_00);
      }
      else {
        local_148 = (float *)(this_00->mPos & 0xfffffffffffffffe);
        local_150 = &Max.y;
        local_c8 = local_148 + 3;
        local_b8 = &local_15c;
        local_a4 = *local_148 - *local_c8;
        local_a8 = local_148[1] - local_148[4];
        local_ac = local_148[2] - local_148[5];
        local_a0 = &local_15c;
        local_15c = local_a4;
        fStack_158 = local_a8;
        Max.z = (float)((ulong)_local_15c >> 0x20);
        Max.y = (float)_local_15c;
        local_140 = &local_15c;
        local_f8 = (float *)(this_00->mPos & 0xfffffffffffffffe);
        local_100 = local_2a8;
        local_68 = local_f8 + 3;
        local_58 = &local_10c;
        local_44 = *local_f8 + *local_68;
        local_48 = local_f8[1] + local_f8[4];
        local_4c = local_f8[2] + local_f8[5];
        local_40 = &local_10c;
        local_10c = local_44;
        fStack_108 = local_48;
        local_2a8._4_4_ = (undefined4)((ulong)_local_10c >> 0x20);
        local_2a8._0_4_ = (undefined4)_local_10c;
        local_f0 = &local_10c;
        uVar3 = this_00->mPos & 0xfffffffffffffffe;
        if (uVar3 == 0) {
          local_330 = (float *)0x0;
        }
        else {
          local_330 = (float *)(uVar3 + 0x30);
        }
        local_170 = local_330;
        local_178 = &Max_.y;
        local_98 = local_330 + 3;
        local_88 = &local_184;
        local_90 = local_330;
        local_74 = *local_330 - *local_98;
        local_78 = local_330[1] - local_330[4];
        local_7c = local_330[2] - local_330[5];
        local_70 = &local_184;
        local_184 = local_74;
        fStack_180 = local_78;
        Max_.y = local_184;
        Max_.z = fStack_180;
        uVar2 = Max_._4_8_;
        local_168 = &local_184;
        uVar3 = this_00->mPos & 0xfffffffffffffffe;
        if (uVar3 == 0) {
          local_348 = (float *)0x0;
        }
        else {
          local_348 = (float *)(uVar3 + 0x30);
        }
        local_120 = local_348;
        local_128 = (long)&Current + 4;
        local_38 = local_348 + 3;
        local_28 = &local_134;
        local_30 = local_348;
        local_14 = *local_348 + *local_38;
        local_18 = local_348[1] + local_348[4];
        local_1c = local_348[2] + local_348[5];
        local_10 = &local_134;
        local_134._0_4_ = local_14;
        local_134._4_4_ = local_18;
        stack0xfffffffffffffd34 = local_134;
        uVar1 = stack0xfffffffffffffd34;
        Max_.y = (float)_local_184;
        Current._4_4_ = (float)local_134;
        local_118 = &local_134;
        local_e0 = &Max.y;
        local_e8 = &Max_.y;
        if (Max_.y <= Max.y) {
          local_364 = Max_.y;
        }
        else {
          local_364 = Max.y;
        }
        Max.y = local_364;
        Max_.z = SUB84(_local_184,4);
        if (Max_.z <= Max.z) {
          local_368 = Max_.z;
        }
        else {
          local_368 = Max.z;
        }
        Max.z = local_368;
        local_36c = local_7c;
        if (Min.x < local_7c) {
          local_36c = Min.x;
        }
        Min.x = local_36c;
        local_d0 = local_2a8;
        local_d8 = (long)&Current + 4;
        if ((float)local_2a8._0_4_ <= Current._4_4_) {
          local_37c = Current._4_4_;
        }
        else {
          local_37c = (float)local_2a8._0_4_;
        }
        local_2a8._0_4_ = local_37c;
        Index = (udword)((ulong)local_134 >> 0x20);
        if ((float)local_2a8._4_4_ <= (float)Index) {
          local_380 = (float)Index;
        }
        else {
          local_380 = (float)local_2a8._4_4_;
        }
        local_2a8._4_4_ = local_380;
        local_384 = local_1c;
        if (local_1c < local_4c) {
          local_384 = local_4c;
        }
        Max.x = local_384;
        local_c0 = local_148;
        local_60 = local_f8;
        unique0x10000337 = uVar1;
        Max_.x = local_1c;
        Max_._4_8_ = uVar2;
        IceMaths::AABB::SetMinMax(&this_00->mBV,(Point *)&Max.y,(Point *)local_2a8);
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AABBTree::Refit2(AABBTreeBuilder* builder)
{
	// Checkings
	if(!builder)	return false;

	ASSERT(mPool);

	// Bottom-up update
	Point Min,Max;
	Point Min_,Max_;
	udword Index = mTotalNbNodes;
	while(Index--)
	{
		AABBTreeNode& Current = mPool[Index];

		if(Current.IsLeaf())
		{
			builder->ComputeGlobalBox(Current.GetPrimitives(), Current.GetNbPrimitives(), *(AABB*)Current.GetAABB());
		}
		else
		{
			Current.GetPos()->GetAABB()->GetMin(Min);
			Current.GetPos()->GetAABB()->GetMax(Max);

			Current.GetNeg()->GetAABB()->GetMin(Min_);
			Current.GetNeg()->GetAABB()->GetMax(Max_);

			Min.Min(Min_);
			Max.Max(Max_);

			((AABB*)Current.GetAABB())->SetMinMax(Min, Max);
		}
	}
	return true;
}